

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer1.c
# Opt level: O2

ktx_error_code_e ktxTexture1_WriteToStream(ktxTexture1 *This,ktxStream *dststr)

{
  ktxHashList *pHead;
  undefined4 uVar1;
  ktx_uint32_t kVar2;
  ktx_uint32_t kVar3;
  ktx_error_code_e kVar4;
  uint uVar5;
  uint uVar6;
  ktx_size_t kVar7;
  uint uVar8;
  bool bVar9;
  ktx_uint32_t local_94;
  ktx_uint8_t *pKvd;
  uint local_84;
  uint local_80;
  ktx_uint32_t faceLodSize;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  uStack_50 = 0;
  local_78 = 0xbb31312058544bab;
  pKvd = (ktx_uint8_t *)0x0;
  if (dststr == (ktxStream *)0x0) {
    kVar4 = KTX_INVALID_VALUE;
  }
  else {
    kVar4 = KTX_INVALID_OPERATION;
    if ((This->pData != (ktx_uint8_t *)0x0) &&
       ((This->kvDataHead == (ktxHashList)0x0 || (This->kvData == (ktx_uint8_t *)0x0)))) {
      uStack_70 = 0x40302010a1a0a0d;
      uStack_60._0_4_ = This->glFormat;
      uStack_60._4_4_ = This->glInternalformat;
      local_58 = (ulong)This->glBaseInternalformat;
      local_68 = (ulong)This->glType;
      kVar2 = ktxTexture1_glTypeSize(This);
      local_68 = CONCAT44(kVar2,(undefined4)local_68);
      local_58 = CONCAT44(This->baseWidth,(undefined4)local_58);
      if (This->numDimensions < 2) {
        kVar2 = 0;
        kVar3 = 0;
      }
      else {
        kVar2 = This->baseHeight;
        kVar3 = 0;
        if (This->numDimensions != 2) {
          kVar3 = This->baseDepth;
        }
      }
      uStack_50 = CONCAT44(kVar3,kVar2);
      kVar2 = 0;
      if (This->isArray == true) {
        kVar2 = This->numLayers;
      }
      local_48 = CONCAT44(local_48._4_4_,kVar2);
      if (This->isCubemap == true) {
        if (This->numFaces != 6) {
LAB_0024b188:
          __assert_fail("This->isCubemap ? This->numFaces == 6 : This->numFaces == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/writer1.c"
                        ,0x127,
                        "ktx_error_code_e ktxTexture1_WriteToStream(ktxTexture1 *, ktxStream *)");
        }
        uVar1 = 6;
      }
      else {
        if (This->numFaces != 1) goto LAB_0024b188;
        uVar1 = 1;
      }
      local_48 = CONCAT44(uVar1,kVar2);
      kVar2 = This->numLevels;
      if (This->generateMipmaps == true) {
        bVar9 = kVar2 != 1;
        kVar2 = 0;
        if (bVar9) {
LAB_0024afef:
          __assert_fail("This->generateMipmaps ? This->numLevels == 1 : This->numLevels >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/writer1.c"
                        ,0x129,
                        "ktx_error_code_e ktxTexture1_WriteToStream(ktxTexture1 *, ktxStream *)");
        }
      }
      else if (kVar2 == 0) goto LAB_0024afef;
      pHead = &This->kvDataHead;
      uStack_40._0_4_ = kVar2;
      if (*pHead == (ktxHashList)0x0) {
        if (This->kvData == (ktx_uint8_t *)0x0) {
          uStack_40._4_4_ = 0;
        }
        else {
          uStack_40._4_4_ = This->kvDataLen;
          pKvd = This->kvData;
        }
      }
      else {
        ktxHashList_Serialize(pHead,(uint *)((long)&uStack_40 + 4),&pKvd);
      }
      kVar4 = (*dststr->write)(dststr,&local_78,0x40,1);
      if (kVar4 == KTX_SUCCESS) {
        if ((ulong)uStack_40._4_4_ != 0) {
          if (pKvd == (ktx_uint8_t *)0x0) {
            __assert_fail("pKvd != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/writer1.c"
                          ,0x13d,
                          "ktx_error_code_e ktxTexture1_WriteToStream(ktxTexture1 *, ktxStream *)");
          }
          kVar4 = (*dststr->write)(dststr,pKvd,1,(ulong)uStack_40._4_4_);
          if (*pHead != (ktxHashList)0x0) {
            free(pKvd);
          }
          if (kVar4 != KTX_SUCCESS) {
            return kVar4;
          }
        }
        uVar8 = 0;
        kVar4 = KTX_SUCCESS;
        uVar6 = 0;
        while (uVar6 < This->numLevels) {
          kVar7 = ktxTexture_doCalcFaceLodSize((ktxTexture *)This,uVar6,KTX_FORMAT_VERSION_ONE);
          faceLodSize = (ktx_uint32_t)kVar7;
          kVar7 = (*This->vtbl->GetImageSize)((ktxTexture *)This,uVar6);
          uVar5 = This->baseDepth >> ((byte)uVar6 & 0x1f);
          local_94 = uVar5 + (uVar5 == 0);
          if (This->isCubemap == true) {
            local_94 = This->numFaces;
          }
          local_84 = uVar6;
          kVar4 = (*dststr->write)(dststr,&faceLodSize,4,1);
          if (kVar4 != KTX_SUCCESS) {
            return kVar4;
          }
          kVar4 = KTX_SUCCESS;
          uVar6 = 0;
          while (kVar2 = local_94, uVar6 < This->numLayers) {
            while (local_80 = uVar6, kVar2 != 0) {
              kVar4 = (*dststr->write)(dststr,This->pData + uVar8,kVar7,1);
              uVar8 = uVar8 + (int)kVar7;
              kVar2 = kVar2 - 1;
              uVar6 = local_80;
            }
            uVar6 = local_80 + 1;
          }
          uVar6 = local_84 + 1;
        }
      }
    }
  }
  return kVar4;
}

Assistant:

KTX_error_code
ktxTexture1_WriteToStream(ktxTexture1* This, ktxStream* dststr)
{
    KTX_header header = { .identifier = KTX_IDENTIFIER_REF };
    KTX_error_code result = KTX_SUCCESS;
    ktx_uint8_t* pKvd = 0;
    ktx_uint32_t level, levelOffset;

    if (!dststr) {
        return KTX_INVALID_VALUE;
    }

    if (This->pData == NULL)
        return KTX_INVALID_OPERATION;

    if (This->kvDataHead && This->kvData)
        return KTX_INVALID_OPERATION;

    //endianess int.. if this comes out reversed, all of the other ints will too.
    header.endianness = KTX_ENDIAN_REF;
    header.glInternalformat = This->glInternalformat;
    header.glFormat = This->glFormat;
    header.glBaseInternalformat = This->glBaseInternalformat;
    header.glType = This->glType;
    header.glTypeSize = ktxTexture1_glTypeSize(This);
    header.pixelWidth = This->baseWidth;
    header.pixelHeight = This->numDimensions > 1 ? This->baseHeight : 0;
    header.pixelDepth = This->numDimensions > 2 ? This->baseDepth : 0;
    header.numberOfArrayElements = This->isArray ? This->numLayers : 0;
    assert (This->isCubemap ? This->numFaces == 6 : This->numFaces == 1);
    header.numberOfFaces = This->numFaces;
    assert (This->generateMipmaps ? This->numLevels == 1 : This->numLevels >= 1);
    header.numberOfMipLevels = This->generateMipmaps ? 0 : This->numLevels;

    if (This->kvDataHead != NULL) {
        ktxHashList_Serialize(&This->kvDataHead,
                              &header.bytesOfKeyValueData, &pKvd);
    } else if (This->kvData) {
        pKvd = This->kvData;
        header.bytesOfKeyValueData = This->kvDataLen;
    } else {
        header.bytesOfKeyValueData = 0;
    }

    //write header
    result = dststr->write(dststr, &header, sizeof(KTX_header), 1);
    if (result != KTX_SUCCESS)
        return result;

    //write keyValueData
    if (header.bytesOfKeyValueData != 0) {
        assert(pKvd != NULL);

        result = dststr->write(dststr, pKvd, 1, header.bytesOfKeyValueData);
        if (This->kvDataHead != NULL)
            free(pKvd);
        if (result != KTX_SUCCESS)
            return result;
    }

    /* Write the image data */
    for (level = 0, levelOffset=0; level < This->numLevels; ++level)
    {
        ktx_uint32_t faceLodSize, layer, levelDepth, numImages;
        ktx_size_t imageSize;

        faceLodSize = (ktx_uint32_t)ktxTexture_doCalcFaceLodSize(ktxTexture(This),
                                                    level,
                                                    KTX_FORMAT_VERSION_ONE);
        imageSize = ktxTexture_GetImageSize(ktxTexture(This), level);
        levelDepth = MAX(1, This->baseDepth >> level);
        if (This->isCubemap && !This->isArray)
            numImages = This->numFaces;
        else
            numImages = This->isCubemap ? This->numFaces : levelDepth;

        result = dststr->write(dststr, &faceLodSize, sizeof(faceLodSize), 1);
        if (result != KTX_SUCCESS)
            goto cleanup;

        for (layer = 0; layer < This->numLayers; layer++) {
            ktx_uint32_t faceSlice;

            for (faceSlice = 0; faceSlice < numImages; faceSlice++) {
                result = dststr->write(dststr, This->pData + levelOffset,
                                       imageSize, 1);
                levelOffset += (ktx_uint32_t)imageSize;
            }
        }
    }

cleanup:
    return result;
}